

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rewriting.cpp
# Opt level: O1

tuple<NS_*,_NS_*> test_graphs::nat_has_nested(void)

{
  NS *pNVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  N *pNVar4;
  N *pNVar5;
  N *this;
  NS *graph;
  NS *pNVar6;
  N *pNVar7;
  _Head_base<0UL,_NS_*,_false> extraout_RDX;
  NS *in_RDI;
  tuple<NS_*,_NS_*> tVar8;
  N *local_58;
  N *local_50;
  N *local_48;
  NS *local_40;
  _Tuple_impl<1UL,_NS_*> local_38;
  
  local_38.super__Head_base<1UL,_NS_*,_false>._M_head_impl =
       (_Head_base<1UL,_NS_*,_false>)(_Head_base<1UL,_NS_*,_false>)in_RDI;
  pNVar1 = (NS *)operator_new(0x18);
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_50 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(local_50,"Nat");
  puVar2 = (undefined8 *)N::operator_new(0x78,pNVar1);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  *(undefined4 *)(puVar2 + 10) = 0;
  *(undefined1 *)(puVar2 + 0xe) = 1;
  puVar3 = (undefined8 *)N::operator_new(0x78,pNVar1);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  *(undefined4 *)(puVar3 + 10) = 1;
  *(undefined1 *)(puVar3 + 0xe) = 1;
  pNVar4 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(pNVar4,"has");
  local_40 = pNVar1;
  pNVar5 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(pNVar5,"is");
  this = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(this,"opposite");
  pNVar7 = local_50;
  local_58 = (N *)puVar2;
  N::connect(local_50,(int)pNVar4,(sockaddr *)&local_58,1);
  local_58 = (N *)puVar3;
  N::connect(pNVar7,(int)pNVar4,(sockaddr *)&local_58,1);
  local_58 = pNVar5;
  local_48 = this;
  N::connect(pNVar4,(int)this,(sockaddr *)&local_58,1);
  local_58 = pNVar4;
  N::connect(pNVar5,(int)this,(sockaddr *)&local_58,1);
  pNVar1 = (NS *)operator_new(0x18);
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  graph = (NS *)operator_new(0x18);
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pNVar6 = (NS *)operator_new(0x18);
  (pNVar6->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar6->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar6->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_50 = (N *)pNVar6;
  pNVar7 = (N *)N::operator_new(0x78,pNVar1);
  (pNVar7->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar7->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar7->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pNVar7->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar7->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar7->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pNVar7->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar7->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar7->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(NS **)&(pNVar7->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>._M_u =
       graph;
  *(__index_type *)
   ((long)&(pNVar7->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*> + 0x20)
       = '\x03';
  puVar2 = (undefined8 *)N::operator_new(0x78,pNVar1);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[10] = pNVar6;
  *(undefined1 *)(puVar2 + 0xe) = 3;
  pNVar4 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(pNVar4,"p");
  pNVar5 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(pNVar5,"np");
  local_58 = (N *)puVar2;
  N::connect(pNVar7,(int)pNVar4,(sockaddr *)&local_58,1);
  local_58 = pNVar5;
  N::connect(pNVar4,(int)local_48,(sockaddr *)&local_58,1);
  pNVar7 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(pNVar7,"x");
  pNVar4 = (N *)N::operator_new(0x78,(NS *)local_50);
  N::N<char_const*>(pNVar4,"y");
  local_58 = pNVar7;
  N::connect(pNVar4,(int)pNVar5,(sockaddr *)&local_58,1);
  *(NS **)local_38.super__Head_base<1UL,_NS_*,_false>._M_head_impl = pNVar1;
  *(NS **)((long)local_38.super__Head_base<1UL,_NS_*,_false>._M_head_impl + 8) = local_40;
  tVar8.super__Tuple_impl<0UL,_NS_*,_NS_*>.super__Head_base<0UL,_NS_*,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  tVar8.super__Tuple_impl<0UL,_NS_*,_NS_*>.super__Tuple_impl<1UL,_NS_*>.
  super__Head_base<1UL,_NS_*,_false>._M_head_impl =
       local_38.super__Head_base<1UL,_NS_*,_false>._M_head_impl;
  return (tuple<NS_*,_NS_*>)tVar8.super__Tuple_impl<0UL,_NS_*,_NS_*>;
}

Assistant:

std::tuple<NS*, NS*> test_graphs::nat_has_nested() {
    auto g = new NS();
    auto n1 = new(g) N("Nat"), n2 = new(g) N(0), n3 = new(g) N(1);
    auto has = new(g) N("has"), is = new(g) N("is");
    auto opp = new(g) N("opposite");

    n1->connect(has, {n2});
    n1->connect(has, {n3});
    has->connect(opp, {is});
    is->connect(opp, {has});

    auto to_match = new NS(), x_g = new NS(), y_g = new NS();
    auto x = new(to_match) N(x_g), y = new(to_match) N(y_g);
    auto p = new(to_match) N("p"), np = new(to_match) N("np");
    x->connect(p, {y});
    p->connect(opp, {np});

    auto x_ = new(x_g) N("x"), y_ = new(y_g) N("y");
    y_->connect(np, {x_});

    return {g, to_match};
}